

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O1

void gmath::div<double>(Polynomial<double> *p,Polynomial<double> *d,Polynomial<double> *q,
                       Polynomial<double> *r)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int local_4c;
  long local_40;
  
  q->used = 1;
  *q->c = 0.0;
  Polynomial<double>::operator=(r,p);
  uVar4 = p->used - d->used;
  if (-1 < (int)uVar4) {
    iVar2 = p->used + ~d->used;
    local_4c = uVar4 - 2;
    uVar7 = ~(ulong)uVar4;
    local_40 = uVar7 * 8;
    uVar6 = (ulong)uVar4;
    do {
      lVar3 = (long)d->used + uVar6 + -1;
      dVar8 = 0.0;
      if (lVar3 < r->used) {
        dVar8 = r->c[lVar3];
      }
      Polynomial<double>::set(q,(int)uVar6,dVar8 / d->c[d->used + -1]);
      iVar5 = d->used;
      if ((long)uVar6 < (long)((int)uVar6 + -1 + iVar5)) {
        lVar3 = (long)(iVar2 + iVar5);
        iVar5 = iVar5 + local_4c;
        do {
          dVar9 = 0.0;
          dVar8 = 0.0;
          if (lVar3 <= r->used) {
            dVar8 = r->c[lVar3 + -1];
          }
          if ((long)uVar6 < (long)q->used) {
            dVar9 = q->c[uVar6];
          }
          dVar10 = 0.0;
          if ((long)(uVar7 + lVar3) < (long)d->used) {
            dVar10 = *(double *)((long)d->c + lVar3 * 8 + local_40);
          }
          lVar3 = lVar3 + -1;
          Polynomial<double>::set(r,iVar5,dVar8 - dVar9 * dVar10);
          iVar5 = iVar5 + -1;
        } while ((long)uVar6 < lVar3);
      }
      iVar2 = iVar2 + -1;
      local_4c = local_4c + -1;
      local_40 = local_40 + 8;
      uVar7 = uVar7 + 1;
      bVar1 = 0 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar1);
  }
  if (d->used <= p->used) {
    iVar2 = d->used + -1;
    do {
      Polynomial<double>::set(r,iVar2,0.0);
      iVar2 = iVar2 + 1;
    } while (iVar2 < p->used);
  }
  return;
}

Assistant:

void div(const Polynomial<T> &p, const Polynomial<T> &d,
                           Polynomial<T> &q, Polynomial<T> &r)
{
  // initialisation

  q.init();
  r=p;

  // perform division

  for (int k=p.getDegree()-d.getDegree(); k>=0; k--)
  {
    q.set(k, r[d.getDegree()+k]/d[d.getDegree()]);

    for (int i=d.getDegree()+k-1; i>=k; i--)
    {
      r.set(i, r[i]-q[k]*d[i-k]);
    }
  }

  // set leading coefficients of working array zero

  for (int i=d.getDegree(); i<p.getDegree()+1; i++)
  {
    r.set(i, 0);
  }
}